

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.hpp
# Opt level: O3

uint64_t __thiscall bit_stream::get_int(bit_stream *this,size_t bits)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  uint uVar4;
  byte bVar5;
  
  if (bits == 0) {
    return 0;
  }
  puVar1 = this->last_ptr;
  puVar3 = this->cur_ptr;
  if (puVar3 == puVar1 + 1) {
    puVar2 = this->of;
    puVar3 = this->first_ptr;
    this->cur_ptr = puVar3;
    this->of = puVar2 + 1;
    *puVar3 = *puVar2;
    this->bytes_consumed = this->bytes_consumed + 4;
  }
  if ((puVar3 == puVar1) || (bVar5 = this->in_word_offset, 0x20 < bVar5 + bits)) {
    puVar2 = this->of;
    this->of = puVar2 + 1;
    *puVar1 = *puVar2;
    this->bytes_consumed = this->bytes_consumed + 4;
    bVar5 = this->in_word_offset;
  }
  uVar4 = *puVar3 >> (bVar5 & 0x1f);
  bVar5 = bVar5 + (char)bits;
  this->in_word_offset = bVar5;
  if (bVar5 < 0x20) {
    uVar4 = uVar4 & *(uint *)(::bits::lo_set + (bits & 0xff) * 4);
  }
  else {
    if (bVar5 == 0x20) {
      this->in_word_offset = '\0';
      this->cur_ptr = puVar3 + 1;
      goto LAB_0012873e;
    }
    bVar5 = bVar5 & 0x1f;
    this->in_word_offset = bVar5;
    this->cur_ptr = puVar3 + 1;
    uVar4 = uVar4 | (*(uint *)(::bits::lo_set + (ulong)bVar5 * 4) & puVar3[1]) <<
                    (((uint)bits & 0xff) - (uint)bVar5 & 0x1f);
    puVar3 = puVar3 + 1;
  }
  if ((puVar3 == puVar1) && (bVar5 != 0)) {
    this->cur_ptr = this->first_ptr;
    *this->first_ptr = *puVar1;
  }
LAB_0012873e:
  return (ulong)uVar4;
}

Assistant:

uint64_t get_int(size_t bits)
    {
        if (bits == 0)
            return 0;
        if (cur_ptr == last_ptr + 1) {
            cur_ptr = first_ptr;
            *first_ptr = *of++;
            bytes_consumed += sizeof(uint32_t);
        }
        if (cur_ptr == last_ptr || (size_t(in_word_offset) + bits > 32)) {
            *last_ptr = *of++;
            bytes_consumed += sizeof(uint32_t);
        }
        uint32_t x = bits::read_int(cur_ptr, in_word_offset, bits);
        if (cur_ptr == last_ptr && in_word_offset != 0) {
            cur_ptr = first_ptr;
            *first_ptr = *last_ptr;
        }
        return x;
    }